

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

regexp_flag __thiscall mjs::regexp_flags_from_string(mjs *this,wstring_view s)

{
  uint uVar1;
  regexp_flag rVar2;
  regexp_flag rVar3;
  size_t sVar4;
  ostream *poVar5;
  runtime_error *this_00;
  long lVar6;
  char *__s;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  if (this == (mjs *)0x0) {
    rVar3 = none;
  }
  else {
    lVar6 = 0;
    __s = "Invalid";
    rVar3 = none;
    do {
      uVar1 = *(uint *)(s._M_len + lVar6);
      if (SUB41(uVar1,0) == (string)0x67) {
        rVar2 = global;
      }
      else if ((uVar1 & 0xff) == 0x6d) {
        rVar2 = multiline;
      }
      else {
        if ((uVar1 & 0xff) != 0x69) goto LAB_0019b26d;
        rVar2 = ignore_case;
      }
      if ((rVar2 & rVar3) != none) {
        __s = "Duplicate";
LAB_0019b26d:
        std::__cxx11::ostringstream::ostringstream(local_190);
        if ((uVar1 & 0xff80) != 0) {
          __assert_fail("static_cast<char16_t>(ch) <= 0x7f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp.cpp"
                        ,0x28,"regexp_flag mjs::regexp_flags_from_string(std::wstring_view)");
        }
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," flag \'",7);
        local_1b0[0] = SUB41(uVar1,0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_190,(char *)local_1b0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\' given to RegExp constructor",0x1d);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_1b0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      rVar3 = rVar2 | rVar3;
      lVar6 = lVar6 + 4;
    } while ((long)this * 4 != lVar6);
  }
  return rVar3;
}

Assistant:

regexp_flag regexp_flags_from_string(std::wstring_view s) {
    auto f = regexp_flag::none;
    for (const auto ch: s) {
        const regexp_flag here = regexp_flag_from_char(static_cast<char>(ch));
        if (here == regexp_flag::none || (f & here) != regexp_flag::none) {
            std::ostringstream oss;
            assert(static_cast<char16_t>(ch) <= 0x7f); // TODO: Report better...
            oss << (here == regexp_flag::none ? "Invalid" : "Duplicate") << " flag '" << static_cast<char>(ch) << "' given to RegExp constructor";
            throw std::runtime_error(oss.str());
        }
        f = f | here;
    }
    return f;
}